

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,char *name,QPoint *point)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = uniformLocation(this,name);
  if (iVar2 != -1) {
    (**(code **)(**(long **)(*(long *)&this->field_0x8 + 0xd0) + 0x3a8))(iVar2,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(const char *name, const QPoint& point)
{
    setUniformValue(uniformLocation(name), point);
}